

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dwarf.cpp
# Opt level: O2

StringRef llvm::dwarf::AttributeValueString(uint16_t Attr,uint Val)

{
  StringRef SVar1;
  int iVar2;
  undefined6 in_register_0000003a;
  StringRef SVar3;
  
  iVar2 = (int)CONCAT62(in_register_0000003a,Attr);
  if (iVar2 == 9) {
    if (Val == 1) {
      SVar3.Length = 0x10;
      SVar3.Data = "DW_ORD_col_major";
      return SVar3;
    }
    if (Val != 0) {
      return (StringRef)ZEXT816(0);
    }
    SVar1.Length = 0x10;
    SVar1.Data = "DW_ORD_row_major";
    return SVar1;
  }
  if (iVar2 != 0x13) {
    if (iVar2 == 0x17) {
      SVar3 = VisibilityString(Val);
      return SVar3;
    }
    if (iVar2 == 0x20) {
      SVar3 = InlineCodeString(Val);
      return SVar3;
    }
    if (iVar2 != 0x3fe6) {
      if (iVar2 == 0x36) {
        SVar3 = ConventionString(Val);
        return SVar3;
      }
      if (iVar2 == 0x3e) {
        SVar3 = AttributeEncodingString(Val);
        return SVar3;
      }
      if (iVar2 == 0x42) {
        SVar3 = CaseString(Val);
        return SVar3;
      }
      if (iVar2 == 0x4c) {
        SVar3 = VirtualityString(Val);
        return SVar3;
      }
      if (iVar2 == 0x5e) {
        SVar3 = DecimalSignString(Val);
        return SVar3;
      }
      if (iVar2 == 0x65) {
        SVar3 = EndianityString(Val);
        return SVar3;
      }
      if (iVar2 == 0x8b) {
        SVar3 = DefaultedMemberString(Val);
        return SVar3;
      }
      if (iVar2 != 0x32) {
        return (StringRef)ZEXT816(0);
      }
      SVar3 = AccessibilityString(Val);
      return SVar3;
    }
  }
  SVar3 = LanguageString(Val);
  return SVar3;
}

Assistant:

StringRef llvm::dwarf::AttributeValueString(uint16_t Attr, unsigned Val) {
  switch (Attr) {
  case DW_AT_accessibility:
    return AccessibilityString(Val);
  case DW_AT_virtuality:
    return VirtualityString(Val);
  case DW_AT_language:
    return LanguageString(Val);
  case DW_AT_encoding:
    return AttributeEncodingString(Val);
  case DW_AT_decimal_sign:
    return DecimalSignString(Val);
  case DW_AT_endianity:
    return EndianityString(Val);
  case DW_AT_visibility:
    return VisibilityString(Val);
  case DW_AT_identifier_case:
    return CaseString(Val);
  case DW_AT_calling_convention:
    return ConventionString(Val);
  case DW_AT_inline:
    return InlineCodeString(Val);
  case DW_AT_ordering:
    return ArrayOrderString(Val);
  case DW_AT_APPLE_runtime_class:
    return LanguageString(Val);
  case DW_AT_defaulted:
    return DefaultedMemberString(Val);
  }

  return StringRef();
}